

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::allocDataBlock
          (MutableCodePointTrie *this,int32_t blockLength)

{
  int iVar1;
  int iVar2;
  uint32_t *__dest;
  uint32_t *newData;
  int32_t capacity;
  int32_t newTop;
  int32_t newBlock;
  int32_t blockLength_local;
  MutableCodePointTrie *this_local;
  
  iVar1 = this->dataLength;
  iVar2 = iVar1 + blockLength;
  if (this->dataCapacity < iVar2) {
    if (this->dataCapacity < 0x20000) {
      newData._0_4_ = 0x20000;
    }
    else {
      if (0x10ffff < this->dataCapacity) {
        return -1;
      }
      newData._0_4_ = 0x110000;
    }
    __dest = (uint32_t *)uprv_malloc_63((long)((int)newData << 2));
    if (__dest == (uint32_t *)0x0) {
      return -1;
    }
    memcpy(__dest,this->data,(long)this->dataLength << 2);
    uprv_free_63(this->data);
    this->data = __dest;
    this->dataCapacity = (int)newData;
  }
  this->dataLength = iVar2;
  return iVar1;
}

Assistant:

int32_t MutableCodePointTrie::allocDataBlock(int32_t blockLength) {
    int32_t newBlock = dataLength;
    int32_t newTop = newBlock + blockLength;
    if (newTop > dataCapacity) {
        int32_t capacity;
        if (dataCapacity < MEDIUM_DATA_LENGTH) {
            capacity = MEDIUM_DATA_LENGTH;
        } else if (dataCapacity < MAX_DATA_LENGTH) {
            capacity = MAX_DATA_LENGTH;
        } else {
            // Should never occur.
            // Either MAX_DATA_LENGTH is incorrect,
            // or the code writes more values than should be possible.
            return -1;
        }
        uint32_t *newData = (uint32_t *)uprv_malloc(capacity * 4);
        if (newData == nullptr) {
            return -1;
        }
        uprv_memcpy(newData, data, (size_t)dataLength * 4);
        uprv_free(data);
        data = newData;
        dataCapacity = capacity;
    }
    dataLength = newTop;
    return newBlock;
}